

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_> *pFVar4
  ;
  Fad<double> *pFVar5;
  double *pdVar6;
  Fad<double> *pFVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  value_type vVar12;
  
  pFVar3 = (((fadexpr->fadexpr_).left_)->fadexpr_).left_;
  uVar1 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 <= (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar11 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar11 = (long)(int)uVar2 << 3;
      }
      pdVar10 = (double *)operator_new__(uVar11);
      (this->dx_).ptr_to_data = pdVar10;
    }
  }
  if (uVar2 != 0) {
    pdVar10 = (this->dx_).ptr_to_data;
    pFVar4 = (fadexpr->fadexpr_).left_;
    pFVar3 = (pFVar4->fadexpr_).left_;
    pFVar5 = (pFVar3->fadexpr_).left_;
    if ((((pFVar5->dx_).num_elts == 0) || ((((pFVar3->fadexpr_).right_)->dx_).num_elts == 0)) ||
       ((((fadexpr->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        uVar11 = 0;
        do {
          vVar12 = FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar11);
          pdVar10[uVar11] = vVar12;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
    }
    else if (0 < (int)uVar2) {
      pdVar6 = *(double **)((long)&pFVar5->dx_ + 8);
      pFVar7 = (pFVar3->fadexpr_).right_;
      pdVar8 = (pFVar7->dx_).ptr_to_data;
      pdVar9 = (((fadexpr->fadexpr_).right_)->dx_).ptr_to_data;
      uVar11 = 0;
      do {
        pdVar10[uVar11] =
             (pdVar6[uVar11] * pFVar7->val_ + pdVar8[uVar11] * pFVar5->val_) *
             (pFVar4->fadexpr_).right_.constant_ - pdVar9[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar2 != uVar11);
    }
  }
  pFVar4 = (fadexpr->fadexpr_).left_;
  pFVar3 = (pFVar4->fadexpr_).left_;
  this->val_ = ((pFVar3->fadexpr_).left_)->val_ * ((pFVar3->fadexpr_).right_)->val_ *
               (pFVar4->fadexpr_).right_.constant_ - ((fadexpr->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}